

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase389::run(TestCase389 *this)

{
  bool bVar1;
  char (*in_RDX) [45];
  char (*text) [9];
  char (*text_00) [28];
  char (*text_01) [15];
  char (*text_02) [15];
  char (*text_03) [7];
  char (*text_04) [6];
  char (*text_05) [13];
  char (*text_06) [17];
  char (*text_07) [5];
  char (*text_08) [10];
  char (*text_09) [8];
  char (*text_10) [11];
  char (*text_11) [8];
  char (*text_12) [16];
  EncodingResult<kj::String> local_320;
  EncodingResult<kj::String> local_300;
  EncodingResult<kj::String> local_2e0;
  EncodingResult<kj::String> local_2c0;
  EncodingResult<kj::String> local_2a0;
  EncodingResult<kj::String> local_280;
  EncodingResult<kj::String> local_260;
  EncodingResult<kj::String> local_240;
  EncodingResult<kj::String> local_220;
  EncodingResult<kj::String> local_200;
  EncodingResult<kj::String> local_1e0;
  EncodingResult<kj::String> local_1c0;
  EncodingResult<kj::String> local_1a0;
  bool local_179;
  undefined1 auStack_178 [7];
  bool _kj_shouldLog_2;
  String local_168;
  DebugExpression<kj::String> local_150;
  undefined1 local_138 [8];
  DebugComparison<kj::String,_const_char_(&)[31]> _kjCondition_2;
  byte bytes [12];
  bool _kj_shouldLog_1;
  DebugExpression<kj::String> local_d8;
  undefined1 local_c0 [8];
  DebugComparison<kj::String,_const_char_(&)[15]> _kjCondition_1;
  bool _kj_shouldLog;
  String local_78;
  DebugExpression<kj::String> local_60;
  undefined1 local_48 [8];
  DebugComparison<kj::String,_const_char_(&)[55]> _kjCondition;
  TestCase389 *this_local;
  
  _kjCondition._48_8_ = this;
  encodeCEscape<45ul>(&local_78,(kj *)anon_var_dwarf_24b3a0,in_RDX);
  kj::_::DebugExpressionStart::operator<<
            (&local_60,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_78);
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[55]> *)local_48,&local_60,
             &anon_var_dwarf_24b3ac);
  kj::_::DebugExpression<kj::String>::~DebugExpression(&local_60);
  String::~String(&local_78);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_48);
  if (!bVar1) {
    _kjCondition_1._51_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._51_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[243],kj::_::DebugComparison<kj::String,char_const(&)[55]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x187,ERROR,anon_var_dwarf_24b3b8,&anon_var_dwarf_24b3d1,
                 (DebugComparison<kj::String,_const_char_(&)[55]> *)local_48);
      _kjCondition_1._51_1_ = 0;
    }
  }
  kj::_::DebugComparison<kj::String,_const_char_(&)[55]>::~DebugComparison
            ((DebugComparison<kj::String,_const_char_(&)[55]> *)local_48);
  encodeCEscape<9ul>((String *)(bytes + 8),(kj *)"foo\x01\x7fxxx",text);
  kj::_::DebugExpressionStart::operator<<
            (&local_d8,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(String *)(bytes + 8));
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[15]> *)local_c0,&local_d8,
             (char (*) [15])"foo\\001\\177xxx");
  kj::_::DebugExpression<kj::String>::~DebugExpression(&local_d8);
  String::~String((String *)(bytes + 8));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
  if (!bVar1) {
    bytes[7] = kj::_::Debug::shouldLog(ERROR);
    while (bytes[7] != '\0') {
      kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::String,char_const(&)[15]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x189,ERROR,
                 "\"failed: expected \" \"encodeCEscape(\\\"foo\\\\x01\\\\x7fxxx\\\") == \\\"foo\\\\\\\\001\\\\\\\\177xxx\\\"\", _kjCondition"
                 ,(char (*) [71])
                  "failed: expected encodeCEscape(\"foo\\x01\\x7fxxx\") == \"foo\\\\001\\\\177xxx\""
                 ,(DebugComparison<kj::String,_const_char_(&)[15]> *)local_c0);
      bytes[7] = '\0';
    }
  }
  kj::_::DebugComparison<kj::String,_const_char_(&)[15]>::~DebugComparison
            ((DebugComparison<kj::String,_const_char_(&)[15]> *)local_c0);
  _kjCondition_2.result = true;
  _kjCondition_2._49_7_ = 0x78787f01006f6f;
  bytes[0] = 'x';
  bytes[1] = 0x80;
  bytes[2] = 0xfe;
  bytes[3] = 0xff;
  ArrayPtr<unsigned_char_const>::ArrayPtr<12ul>
            ((ArrayPtr<unsigned_char_const> *)auStack_178,(uchar (*) [12])&_kjCondition_2.result);
  encodeCEscape(&local_168,_auStack_178);
  kj::_::DebugExpressionStart::operator<<
            (&local_150,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_168);
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[31]> *)local_138,&local_150,
             (char (*) [31])"foo\\000\\001\\177xxx\\200\\376\\377");
  kj::_::DebugExpression<kj::String>::~DebugExpression(&local_150);
  String::~String(&local_168);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
  if (!bVar1) {
    local_179 = kj::_::Debug::shouldLog(ERROR);
    while (local_179 != false) {
      kj::_::Debug::log<char_const(&)[80],kj::_::DebugComparison<kj::String,char_const(&)[31]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
                 ,0x18b,ERROR,
                 "\"failed: expected \" \"encodeCEscape(bytes) == \\\"foo\\\\\\\\000\\\\\\\\001\\\\\\\\177xxx\\\\\\\\200\\\\\\\\376\\\\\\\\377\\\"\", _kjCondition"
                 ,(char (*) [80])
                  "failed: expected encodeCEscape(bytes) == \"foo\\\\000\\\\001\\\\177xxx\\\\200\\\\376\\\\377\""
                 ,(DebugComparison<kj::String,_const_char_(&)[31]> *)local_138);
      local_179 = false;
    }
  }
  kj::_::DebugComparison<kj::String,_const_char_(&)[31]>::~DebugComparison
            ((DebugComparison<kj::String,_const_char_(&)[31]> *)local_138);
  decodeCEscape<28ul>(&local_1a0,(kj *)"fooo\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\\\bar",text_00);
  (anonymous_namespace)::expectRes<kj::String,char,18ul>
            (&local_1a0,(char (*) [18])"fooo\a\b\f\n\r\t\v\'\"\\bar",false);
  EncodingResult<kj::String>::~EncodingResult(&local_1a0);
  decodeCEscape<15ul>(&local_1c0,(kj *)"foo\\x01\\x7fxxx",text_01);
  (anonymous_namespace)::expectRes<kj::String,char,9ul>
            (&local_1c0,(char (*) [9])"foo\x01\x7fxxx",false);
  EncodingResult<kj::String>::~EncodingResult(&local_1c0);
  decodeCEscape<15ul>(&local_1e0,(kj *)"foo\\001\\177234",text_02);
  (anonymous_namespace)::expectRes<kj::String,char,9ul>
            (&local_1e0,(char (*) [9])"foo\x01\x7f234",false);
  EncodingResult<kj::String>::~EncodingResult(&local_1e0);
  decodeCEscape<7ul>(&local_200,(kj *)"foo\\x1",text_03);
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_200,(char (*) [5])"foo\x01",false);
  EncodingResult<kj::String>::~EncodingResult(&local_200);
  decodeCEscape<6ul>(&local_220,(kj *)"foo\\1",text_04);
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_220,(char (*) [5])"foo\x01",false);
  EncodingResult<kj::String>::~EncodingResult(&local_220);
  decodeCEscape<13ul>(&local_240,(kj *)"foo\\u1234bar",text_05);
  (anonymous_namespace)::expectRes<kj::String,10ul>(&local_240,&anon_var_dwarf_24b4c1,false);
  EncodingResult<kj::String>::~EncodingResult(&local_240);
  decodeCEscape<17ul>(&local_260,(kj *)"foo\\U00045678bar",text_06);
  (anonymous_namespace)::expectRes<kj::String,11ul>(&local_260,&anon_var_dwarf_24b4e5,false);
  EncodingResult<kj::String>::~EncodingResult(&local_260);
  decodeCEscape<5ul>(&local_280,(kj *)"foo\\",text_07);
  (anonymous_namespace)::expectRes<kj::String,char,4ul>(&local_280,(char (*) [4])0x9422c6,true);
  EncodingResult<kj::String>::~EncodingResult(&local_280);
  decodeCEscape<10ul>(&local_2a0,(kj *)"foo\\x123x",text_08);
  (anonymous_namespace)::expectRes<kj::String,6ul>(&local_2a0,(char8_t (*) [6])"foo#x",true);
  EncodingResult<kj::String>::~EncodingResult(&local_2a0);
  decodeCEscape<8ul>(&local_2c0,(kj *)"foo\\u12",text_09);
  (anonymous_namespace)::expectRes<kj::String,5ul>(&local_2c0,(char8_t (*) [5])"foo\x12",true);
  EncodingResult<kj::String>::~EncodingResult(&local_2c0);
  decodeCEscape<11ul>(&local_2e0,(kj *)"foo\\u12xxx",text_10);
  (anonymous_namespace)::expectRes<kj::String,8ul>(&local_2e0,(char8_t (*) [8])"foo\x12xxx",true);
  EncodingResult<kj::String>::~EncodingResult(&local_2e0);
  decodeCEscape<8ul>(&local_300,(kj *)"foo\\U12",text_11);
  (anonymous_namespace)::expectRes<kj::String,5ul>(&local_300,(char8_t (*) [5])"foo\x12",true);
  EncodingResult<kj::String>::~EncodingResult(&local_300);
  decodeCEscape<16ul>(&local_320,(kj *)"foo\\U12xxxxxxxx",text_12);
  (anonymous_namespace)::expectRes<kj::String,13ul>
            (&local_320,(char8_t (*) [13])"foo\x12xxxxxxxx",true);
  EncodingResult<kj::String>::~EncodingResult(&local_320);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerChained) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<Promise<int>>();
  auto inner = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(kj::mv(inner.promise));
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  inner.fulfiller->fulfill(123);

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}